

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O0

void EMIT_OP_RPTR_REG(CodeGenGenericContext *ctx,x86Command op,x86Size size,x86Reg index,
                     int multiplier,x86Reg base,uint shift,x86XmmReg reg2)

{
  x86Argument arg_00;
  CodeGenGenericContext *this;
  x86Argument local_88;
  undefined1 local_68 [16];
  anon_union_8_6_73be8994_for_x86Argument_2 local_58;
  x86Reg local_50;
  x86Reg xStack_4c;
  undefined1 local_48 [8];
  x86Argument arg;
  uint local_20;
  x86Reg base_local;
  int multiplier_local;
  x86Reg index_local;
  x86Size size_local;
  x86Command op_local;
  CodeGenGenericContext *ctx_local;
  
  arg.ptrNum = base;
  local_20 = multiplier;
  base_local = index;
  multiplier_local = size;
  index_local = op;
  _size_local = ctx;
  CodeGenGenericContext::RedirectAddressComputation
            (ctx,&base_local,(int *)&local_20,(x86Reg *)&arg.ptrNum,&shift);
  reg2 = CodeGenGenericContext::RedirectRegister(_size_local,reg2);
  x86Argument::x86Argument
            ((x86Argument *)local_48,multiplier_local,base_local,local_20,arg.ptrNum,shift);
  CodeGenGenericContext::ReadRegister(_size_local,arg.ptrNum);
  CodeGenGenericContext::ReadRegister(_size_local,base_local);
  CodeGenGenericContext::ReadRegister(_size_local,reg2);
  if (index_local != 0x34 && index_local != 0x35) {
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x74d,
                  "void EMIT_OP_RPTR_REG(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, x86XmmReg)"
                 );
  }
  if (arg.ptrNum != 5) {
    local_68._0_8_ = local_48;
    local_68._8_8_ = arg._0_8_;
    local_58 = arg.field_1;
    local_50 = arg.ptrBase;
    xStack_4c = arg.ptrIndex;
    arg_00.field_1 = (anon_union_8_6_73be8994_for_x86Argument_2)arg._0_8_;
    arg_00._0_8_ = local_48;
    arg_00.ptrBase = arg.field_1._0_4_;
    arg_00.ptrIndex = arg.field_1._4_4_;
    arg_00.ptrMult = arg.ptrBase;
    arg_00.ptrNum = arg.ptrIndex;
    CodeGenGenericContext::InvalidateAddressValue(_size_local,arg_00);
    CodeGenGenericContext::MemKillDeadStore(_size_local,(x86Argument *)local_48);
    this = _size_local;
    x86Argument::x86Argument(&local_88,reg2);
    CodeGenGenericContext::MemWrite(this,(x86Argument *)local_48,&local_88);
  }
  _size_local->x86Op->name = index_local;
  (_size_local->x86Op->argA).type = argPtr;
  (_size_local->x86Op->argA).field_1.num = multiplier_local;
  (_size_local->x86Op->argA).ptrIndex = base_local;
  (_size_local->x86Op->argA).ptrMult = local_20;
  (_size_local->x86Op->argA).ptrBase = arg.ptrNum;
  (_size_local->x86Op->argA).ptrNum = shift;
  (_size_local->x86Op->argB).type = argXmmReg;
  (_size_local->x86Op->argB).field_1.xmmArg = reg2;
  _size_local->x86Op = _size_local->x86Op + 1;
  return;
}

Assistant:

void EMIT_OP_RPTR_REG(CodeGenGenericContext &ctx, x86Command op, x86Size size, x86Reg index, int multiplier, x86Reg base, unsigned shift, x86XmmReg reg2)
{
#ifdef NULLC_OPTIMIZE_X86
	ctx.RedirectAddressComputation(index, multiplier, base, shift);

	reg2 = ctx.RedirectRegister(reg2);

	x86Argument arg = x86Argument(size, index, multiplier, base, shift);

	// Register reads
	ctx.ReadRegister(base);
	ctx.ReadRegister(index);
	ctx.ReadRegister(reg2);

	switch(op)
	{
	case o_movss:
	case o_movsd:
		// No tracking for stack
		if(base == rESP)
			break;

		ctx.InvalidateAddressValue(arg);

		ctx.MemKillDeadStore(arg);

		// Track target memory value
		ctx.MemWrite(arg, x86Argument(reg2));
		break;
	default:
		assert(!"unknown instruction");
	}
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argPtr;
	ctx.x86Op->argA.ptrSize = size;
	ctx.x86Op->argA.ptrIndex = index;
	ctx.x86Op->argA.ptrMult = multiplier;
	ctx.x86Op->argA.ptrBase = base;
	ctx.x86Op->argA.ptrNum = shift;
	ctx.x86Op->argB.type = x86Argument::argXmmReg;
	ctx.x86Op->argB.xmmArg = reg2;
	ctx.x86Op++;
}